

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::angularVelocityReset
          (DeadReckoningCalculator *this,Vector *AngularVelocity)

{
  Vector *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  KFLOAT32 *pKVar5;
  KFLOAT32 KVar6;
  float fVar7;
  EulerAngles local_38;
  
  this_00 = &this->m_initAngularVelocity;
  (this->m_initAngularVelocity).m_f32Z = AngularVelocity->m_f32Z;
  KVar6 = AngularVelocity->m_f32Y;
  (this->m_initAngularVelocity).m_f32X = AngularVelocity->m_f32X;
  (this->m_initAngularVelocity).m_f32Y = KVar6;
  toEulerAngularVelocity
            (&local_38,(DeadReckoningCalculator *)AngularVelocity,AngularVelocity,
             &this->m_initOrientation);
  (this->m_initEulerAngularVelocity).m_f32Phi = local_38.m_f32Phi;
  (this->m_initEulerAngularVelocity).m_f32Psi = local_38.m_f32Psi;
  (this->m_initEulerAngularVelocity).m_f32Theta = local_38.m_f32Theta;
  DATA_TYPE::EulerAngles::~EulerAngles(&local_38);
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,0);
  fVar7 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,0);
  (this->m_wwMatrix).Data[0][0] = fVar7 * (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,0);
  fVar7 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,1);
  (this->m_wwMatrix).Data[0][1] = fVar7 * (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,0);
  fVar7 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,2);
  (this->m_wwMatrix).Data[0][2] = fVar7 * (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,1);
  fVar7 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,0);
  (this->m_wwMatrix).Data[1][0] = fVar7 * (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,1);
  fVar7 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,1);
  (this->m_wwMatrix).Data[1][1] = fVar7 * (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,1);
  fVar7 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,2);
  (this->m_wwMatrix).Data[1][2] = fVar7 * (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,2);
  fVar7 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,0);
  (this->m_wwMatrix).Data[2][0] = fVar7 * (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,2);
  fVar7 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,1);
  (this->m_wwMatrix).Data[2][1] = fVar7 * (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,2);
  fVar7 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,2);
  (this->m_wwMatrix).Data[2][2] = fVar7 * (float)*pKVar5;
  (this->m_SkewOmegaMatrix).Data[0][0] = 0.0;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,2);
  (this->m_SkewOmegaMatrix).Data[0][1] = -(float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,1);
  (this->m_SkewOmegaMatrix).Data[0][2] = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,2);
  (this->m_SkewOmegaMatrix).Data[1][0] = (float)*pKVar5;
  (this->m_SkewOmegaMatrix).Data[1][1] = 0.0;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,0);
  (this->m_SkewOmegaMatrix).Data[1][2] = -(float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,1);
  (this->m_SkewOmegaMatrix).Data[2][0] = -(float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,0);
  (this->m_SkewOmegaMatrix).Data[2][1] = (float)*pKVar5;
  (this->m_SkewOmegaMatrix).Data[2][2] = 0.0;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,0);
  fVar7 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,0);
  fVar1 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,1);
  fVar2 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,1);
  fVar3 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,2);
  fVar4 = (float)*pKVar5;
  pKVar5 = DATA_TYPE::Vector::operator[](this_00,2);
  fVar7 = fVar4 * (float)*pKVar5 + fVar2 * fVar3 + fVar7 * fVar1;
  if (fVar7 < 0.0) {
    KVar6 = (KFLOAT32)sqrtf(fVar7);
  }
  else {
    KVar6 = (KFLOAT32)SQRT(fVar7);
  }
  this->m_f64Magnitude = KVar6;
  return;
}

Assistant:

void DeadReckoningCalculator::angularVelocityReset( const Vector & AngularVelocity )
{
    m_initAngularVelocity = AngularVelocity;

    m_initEulerAngularVelocity = toEulerAngularVelocity(AngularVelocity, m_initOrientation);

    // Create the ww matrix
    m_wwMatrix.Data[0][0] = m_initAngularVelocity[0] * m_initAngularVelocity[0];
    m_wwMatrix.Data[0][1] = m_initAngularVelocity[0] * m_initAngularVelocity[1];
    m_wwMatrix.Data[0][2] = m_initAngularVelocity[0] * m_initAngularVelocity[2];

    m_wwMatrix.Data[1][0] = m_initAngularVelocity[1] * m_initAngularVelocity[0];
    m_wwMatrix.Data[1][1] = m_initAngularVelocity[1] * m_initAngularVelocity[1];
    m_wwMatrix.Data[1][2] = m_initAngularVelocity[1] * m_initAngularVelocity[2];

    m_wwMatrix.Data[2][0] = m_initAngularVelocity[2] * m_initAngularVelocity[0];
    m_wwMatrix.Data[2][1] = m_initAngularVelocity[2] * m_initAngularVelocity[1];
    m_wwMatrix.Data[2][2] = m_initAngularVelocity[2] * m_initAngularVelocity[2];

    m_SkewOmegaMatrix.Data[0][0] = 0;
    m_SkewOmegaMatrix.Data[0][1] = - m_initAngularVelocity[2];
    m_SkewOmegaMatrix.Data[0][2] = m_initAngularVelocity[1];

    m_SkewOmegaMatrix.Data[1][0] = m_initAngularVelocity[2];
    m_SkewOmegaMatrix.Data[1][1] = 0;
    m_SkewOmegaMatrix.Data[1][2] = - m_initAngularVelocity[0];

    m_SkewOmegaMatrix.Data[2][0] = - m_initAngularVelocity[1];
    m_SkewOmegaMatrix.Data[2][1] = m_initAngularVelocity[0];
    m_SkewOmegaMatrix.Data[2][2] = 0;

    m_f64Magnitude = sqrt( m_initAngularVelocity[0] * m_initAngularVelocity[0] +
                           m_initAngularVelocity[1] * m_initAngularVelocity[1] +
                           m_initAngularVelocity[2] * m_initAngularVelocity[2] );
}